

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O2

void print_tests(FILE *stream)

{
  int iVar1;
  _func_int **pp_Var2;
  task_entry_t *ptVar3;
  size_t __nmemb;
  char *__s;
  task_entry_t **pptVar4;
  ulong uVar5;
  task_entry_t *helper;
  task_entry_t *ptVar6;
  int n_helpers;
  int iVar7;
  ulong uVar8;
  task_entry_t *helpers [1024];
  
  __nmemb = 0;
  for (pp_Var2 = &TASKS[0].main; *pp_Var2 != (_func_int *)0x0; pp_Var2 = pp_Var2 + 5) {
    __nmemb = __nmemb + 1;
  }
  qsort(TASKS,__nmemb,0x28,compare_task);
  for (ptVar3 = TASKS; ptVar3->main != (_func_int *)0x0; ptVar3 = ptVar3 + 1) {
    if (ptVar3->is_helper == 0) {
      uVar8 = 0;
      pptVar4 = helpers;
      for (ptVar6 = TASKS; iVar7 = (int)uVar8, ptVar6->main != (_func_int *)0x0; ptVar6 = ptVar6 + 1
          ) {
        if (ptVar6->is_helper != 0) {
          iVar1 = strcmp(ptVar6->task_name,ptVar3->task_name);
          if (iVar1 == 0) {
            *pptVar4 = ptVar6;
            pptVar4 = pptVar4 + 1;
            uVar8 = (ulong)(iVar7 + 1);
          }
        }
      }
      __s = ptVar3->task_name;
      if (iVar7 != 0) {
        printf("%-25s (helpers:");
        if (iVar7 < 1) {
          uVar8 = 0;
        }
        for (uVar5 = 0; uVar8 != uVar5; uVar5 = uVar5 + 1) {
          printf(" %s",helpers[uVar5]->process_name);
        }
        __s = ")";
      }
      puts(__s);
    }
  }
  return;
}

Assistant:

void print_tests(FILE* stream) {
  const task_entry_t* helpers[1024];
  const task_entry_t* task;
  int n_helpers;
  int n_tasks;
  int i;

  for (n_tasks = 0, task = TASKS; task->main; n_tasks++, task++);
  qsort(TASKS, n_tasks, sizeof(TASKS[0]), compare_task);

  for (task = TASKS; task->main; task++) {
    if (task->is_helper) {
      continue;
    }

    n_helpers = find_helpers(task, helpers);
    if (n_helpers) {
      printf("%-25s (helpers:", task->task_name);
      for (i = 0; i < n_helpers; i++) {
        printf(" %s", helpers[i]->process_name);
      }
      printf(")\n");
    } else {
      printf("%s\n", task->task_name);
    }
  }
}